

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O0

void __thiscall Fluid_Image::write_static(Fluid_Image *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char **ppcVar7;
  size_t sVar8;
  FILE *__stream;
  int local_90;
  int extra_data;
  char *data;
  size_t nData;
  FILE *f;
  int local_20;
  int chars_per_color;
  int ncolors;
  int i;
  char *idata_name;
  Fluid_Image *this_local;
  
  if (this->img != (Fl_Shared_Image *)0x0) {
    idata_name = (char *)this;
    pcVar6 = name(this);
    pcVar6 = fl_filename_name(pcVar6);
    _ncolors = unique_id(this,"idata",pcVar6,(char *)0x0);
    pcVar6 = name(this);
    pcVar6 = fl_filename_name(pcVar6);
    pcVar6 = unique_id(this,"image",pcVar6,(char *)0x0);
    this->function_name_ = pcVar6;
    iVar1 = Fl_Image::count(&this->img->super_Fl_Image);
    if (iVar1 < 2) {
      iVar1 = Fl_Image::d(&this->img->super_Fl_Image);
      if (iVar1 == 0) {
        write_c("\n");
        if (bitmap_header_written != write_number) {
          write_c("#include <FL/Fl_Bitmap.H>\n");
          bitmap_header_written = write_number;
        }
        write_c("static const unsigned char %s[] =\n",_ncolors);
        ppcVar7 = Fl_Image::data(&this->img->super_Fl_Image);
        pcVar6 = *ppcVar7;
        iVar1 = Fl_Image::w(&this->img->super_Fl_Image);
        iVar2 = Fl_Image::h(&this->img->super_Fl_Image);
        write_cdata(pcVar6,((iVar1 + 7) / 8) * iVar2);
        write_c(";\n");
        pcVar6 = _ncolors;
        uVar3 = Fl_Image::w(&this->img->super_Fl_Image);
        uVar4 = Fl_Image::h(&this->img->super_Fl_Image);
        write_initializer(this,"Fl_Bitmap","%s, %d, %d",pcVar6,(ulong)uVar3,(ulong)uVar4);
      }
      else {
        pcVar6 = name(this);
        pcVar6 = fl_filename_ext(pcVar6);
        iVar1 = strcmp(pcVar6,".jpg");
        if (iVar1 == 0) {
          write_c("\n");
          if (jpeg_header_written != write_number) {
            write_c("#include <FL/Fl_JPEG_Image.H>\n");
            jpeg_header_written = write_number;
          }
          write_c("static const unsigned char %s[] =\n",_ncolors);
          pcVar6 = name(this);
          __stream = (FILE *)fl_fopen(pcVar6,"rb");
          if (__stream != (FILE *)0x0) {
            fseek(__stream,0,2);
            sVar8 = ftell(__stream);
            fseek(__stream,0,0);
            if (sVar8 != 0) {
              pcVar6 = (char *)calloc(sVar8,1);
              fread(pcVar6,sVar8,1,__stream);
              write_cdata(pcVar6,(int)sVar8);
              free(pcVar6);
            }
            fclose(__stream);
          }
          write_c(";\n");
          pcVar6 = name(this);
          pcVar6 = fl_filename_name(pcVar6);
          write_initializer(this,"Fl_JPEG_Image","\"%s\", %s",pcVar6,_ncolors);
        }
        else {
          write_c("\n");
          if (image_header_written != write_number) {
            write_c("#include <FL/Fl_Image.H>\n");
            image_header_written = write_number;
          }
          write_c("static const unsigned char %s[] =\n",_ncolors);
          iVar1 = Fl_Image::ld(&this->img->super_Fl_Image);
          if (iVar1 == 0) {
            local_90 = 0;
          }
          else {
            local_90 = Fl_Image::ld(&this->img->super_Fl_Image);
            iVar1 = Fl_Image::w(&this->img->super_Fl_Image);
            iVar2 = Fl_Image::d(&this->img->super_Fl_Image);
            local_90 = local_90 - iVar1 * iVar2;
          }
          ppcVar7 = Fl_Image::data(&this->img->super_Fl_Image);
          pcVar6 = *ppcVar7;
          iVar1 = Fl_Image::w(&this->img->super_Fl_Image);
          iVar2 = Fl_Image::d(&this->img->super_Fl_Image);
          iVar5 = Fl_Image::h(&this->img->super_Fl_Image);
          write_cdata(pcVar6,(iVar1 * iVar2 + local_90) * iVar5);
          write_c(";\n");
          pcVar6 = _ncolors;
          uVar3 = Fl_Image::w(&this->img->super_Fl_Image);
          uVar4 = Fl_Image::h(&this->img->super_Fl_Image);
          iVar1 = Fl_Image::d(&this->img->super_Fl_Image);
          iVar2 = Fl_Image::ld(&this->img->super_Fl_Image);
          write_initializer(this,"Fl_RGB_Image","%s, %d, %d, %d, %d",pcVar6,(ulong)uVar3,
                            (ulong)uVar4,iVar1,iVar2);
        }
      }
    }
    else {
      write_c("\n");
      if (pixmap_header_written != write_number) {
        write_c("#include <FL/Fl_Pixmap.H>\n");
        pixmap_header_written = write_number;
      }
      write_c("static const char *%s[] = {\n",_ncolors);
      ppcVar7 = Fl_Image::data(&this->img->super_Fl_Image);
      pcVar6 = *ppcVar7;
      ppcVar7 = Fl_Image::data(&this->img->super_Fl_Image);
      sVar8 = strlen(*ppcVar7);
      write_cstring(pcVar6,(int)sVar8);
      ppcVar7 = Fl_Image::data(&this->img->super_Fl_Image);
      __isoc99_sscanf(*ppcVar7,"%*d%*d%d%d",&local_20,(long)&f + 4);
      if (local_20 < 0) {
        write_c(",\n");
        ppcVar7 = Fl_Image::data(&this->img->super_Fl_Image);
        write_cstring(ppcVar7[1],local_20 * -4);
        chars_per_color = 2;
      }
      else {
        for (chars_per_color = 1; chars_per_color <= local_20; chars_per_color = chars_per_color + 1
            ) {
          write_c(",\n");
          ppcVar7 = Fl_Image::data(&this->img->super_Fl_Image);
          pcVar6 = ppcVar7[chars_per_color];
          ppcVar7 = Fl_Image::data(&this->img->super_Fl_Image);
          sVar8 = strlen(ppcVar7[chars_per_color]);
          write_cstring(pcVar6,(int)sVar8);
        }
      }
      for (; iVar1 = chars_per_color, iVar2 = Fl_Image::count(&this->img->super_Fl_Image),
          iVar1 < iVar2; chars_per_color = chars_per_color + 1) {
        write_c(",\n");
        ppcVar7 = Fl_Image::data(&this->img->super_Fl_Image);
        pcVar6 = ppcVar7[chars_per_color];
        iVar1 = Fl_Image::w(&this->img->super_Fl_Image);
        write_cstring(pcVar6,iVar1 * f._4_4_);
      }
      write_c("\n};\n");
      write_initializer(this,"Fl_Pixmap","%s",_ncolors);
    }
  }
  return;
}

Assistant:

void Fluid_Image::write_static() {
  if (!img) return;
  const char *idata_name = unique_id(this, "idata", fl_filename_name(name()), 0);
  function_name_ = unique_id(this, "image", fl_filename_name(name()), 0);
  if (img->count() > 1) {
    // Write Pixmap data...
    write_c("\n");
    if (pixmap_header_written != write_number) {
      write_c("#include <FL/Fl_Pixmap.H>\n");
      pixmap_header_written = write_number;
    }
    write_c("static const char *%s[] = {\n", idata_name);
    write_cstring(img->data()[0], strlen(img->data()[0]));

    int i;
    int ncolors, chars_per_color;
    sscanf(img->data()[0], "%*d%*d%d%d", &ncolors, &chars_per_color);

    if (ncolors < 0) {
      write_c(",\n");
      write_cstring(img->data()[1], ncolors * -4);
      i = 2;
    } else {
      for (i = 1; i <= ncolors; i ++) {
        write_c(",\n");
        write_cstring(img->data()[i], strlen(img->data()[i]));
      }
    }
    for (; i < img->count(); i ++) {
      write_c(",\n");
      write_cstring(img->data()[i], img->w() * chars_per_color);
    }
    write_c("\n};\n");
    write_initializer("Fl_Pixmap", "%s", idata_name);
  } else if (img->d() == 0) {
    // Write Bitmap data...
    write_c("\n");
    if (bitmap_header_written != write_number) {
      write_c("#include <FL/Fl_Bitmap.H>\n");
      bitmap_header_written = write_number;
    }
    write_c("static const unsigned char %s[] =\n", idata_name);
    write_cdata(img->data()[0], ((img->w() + 7) / 8) * img->h());
    write_c(";\n");
    write_initializer( "Fl_Bitmap", "%s, %d, %d", idata_name, img->w(), img->h());
  } else if (strcmp(fl_filename_ext(name()), ".jpg")==0) {
    // Write jpeg image data...
    write_c("\n");
    if (jpeg_header_written != write_number) {
      write_c("#include <FL/Fl_JPEG_Image.H>\n");
      jpeg_header_written = write_number;
    }
    write_c("static const unsigned char %s[] =\n", idata_name);

    FILE *f = fl_fopen(name(), "rb");
    if (!f) {
      // message = "Can't include binary file. Can't open";
    } else {
      fseek(f, 0, SEEK_END);
      size_t nData = ftell(f);
      fseek(f, 0, SEEK_SET);
      if (nData) {
        char *data = (char*)calloc(nData, 1);
        if (fread(data, nData, 1, f)==0) { /* ignore */ }
        write_cdata(data, nData);
        free(data);
      }
      fclose(f);
    }
    
    write_c(";\n");
    write_initializer("Fl_JPEG_Image", "\"%s\", %s", fl_filename_name(name()), idata_name);
  } else {
    // Write image data...
    write_c("\n");
    if (image_header_written != write_number) {
      write_c("#include <FL/Fl_Image.H>\n");
      image_header_written = write_number;
    } 
    write_c("static const unsigned char %s[] =\n", idata_name);
    const int extra_data = img->ld() ? (img->ld()-img->w()*img->d()) : 0;
    write_cdata(img->data()[0], (img->w() * img->d() + extra_data) * img->h());
    write_c(";\n");
    write_initializer("Fl_RGB_Image", "%s, %d, %d, %d, %d", idata_name, img->w(), img->h(), img->d(), img->ld());
  }
}